

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArduinoPressureSensor.h
# Opt level: O3

int GetLatestDataArduinoPressureSensor
              (ARDUINOPRESSURESENSOR *pArduinoPressureSensor,
              ARDUINOPRESSURESENSORDATA *pArduinoPressureSensorData)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ARDUINOPRESSURESENSORDATA *pAVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  ulong __n;
  long lVar11;
  uint uVar12;
  bool bVar13;
  CHRONO chrono;
  char recvbuf [512];
  char savebuf [256];
  timespec local_398;
  timespec local_388;
  undefined8 local_378;
  undefined8 uStack_370;
  long local_368;
  long lStack_360;
  timespec local_358;
  int local_348;
  ARDUINOPRESSURESENSORDATA *local_340;
  char local_338 [255];
  undefined1 auStack_239 [257];
  undefined1 local_138 [264];
  
  iVar5 = clock_getres(4,&local_358);
  if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_388), iVar5 == 0)) {
    local_348 = 0;
    local_378 = 0;
    uStack_370 = 0;
    local_368 = 0;
    lStack_360 = 0;
  }
  memset(local_338,0,0x200);
  memset(local_138,0,0x100);
  iVar5 = (pArduinoPressureSensor->RS232Port).DevType;
  if (iVar5 - 1U < 4) {
    uVar6 = recv((pArduinoPressureSensor->RS232Port).s,local_338,0xff,0);
LAB_001bb187:
    uVar12 = (uint)uVar6;
    if (0 < (int)uVar12) {
      if ((pArduinoPressureSensor->bSaveRawData != 0) &&
         ((FILE *)pArduinoPressureSensor->pfSaveFile != (FILE *)0x0)) {
        fwrite(local_338,uVar6 & 0xffffffff,1,(FILE *)pArduinoPressureSensor->pfSaveFile);
        fflush((FILE *)pArduinoPressureSensor->pfSaveFile);
      }
      local_340 = pArduinoPressureSensorData;
      if (0xfe < uVar12) {
        if (uVar12 == 0xff) {
          do {
            lVar11 = local_368;
            lVar10 = lStack_360;
            if (local_348 == 0) {
              clock_gettime(4,&local_398);
              lVar11 = ((local_398.tv_sec + local_368) - local_388.tv_sec) +
                       (local_398.tv_nsec + lStack_360) / 1000000000;
              lVar10 = (local_398.tv_nsec + lStack_360) % 1000000000 - local_388.tv_nsec;
              if (lVar10 < 0) {
                lVar11 = lVar11 + ~((ulong)-lVar10 / 1000000000);
                lVar10 = lVar10 + 1000000000 + ((ulong)-lVar10 / 1000000000) * 1000000000;
              }
            }
            if (4.0 < (double)lVar10 / 1000000000.0 + (double)lVar11) goto LAB_001bb6ff;
            memcpy(local_138,local_338,0xff);
            iVar5 = (pArduinoPressureSensor->RS232Port).DevType;
            if (iVar5 - 1U < 4) {
              uVar6 = recv((pArduinoPressureSensor->RS232Port).s,local_338,0xff,0);
            }
            else {
              if (iVar5 != 0) goto LAB_001bb6d1;
              uVar6 = read(*(int *)&(pArduinoPressureSensor->RS232Port).hDev,local_338,0xff);
            }
            if ((int)uVar6 < 1) goto LAB_001bb6d1;
            if ((pArduinoPressureSensor->bSaveRawData != 0) &&
               ((FILE *)pArduinoPressureSensor->pfSaveFile != (FILE *)0x0)) {
              fwrite(local_338,uVar6 & 0xffffffff,1,(FILE *)pArduinoPressureSensor->pfSaveFile);
              fflush((FILE *)pArduinoPressureSensor->pfSaveFile);
            }
          } while ((int)uVar6 == 0xff);
        }
        __n = uVar6 & 0xffffffff;
        memmove(auStack_239 + -__n,local_338,__n);
        memcpy(local_338,local_138 + __n,(long)(0xff - (int)uVar6));
        uVar6 = 0xff;
      }
      pcVar7 = strstr(local_338,"Pressure: ");
      if ((pcVar7 == (char *)0x0) || (pcVar8 = strstr(pcVar7 + 10,"\r\n"), pcVar8 == (char *)0x0)) {
        pcVar8 = (char *)0x0;
      }
      else {
        do {
          pcVar8 = pcVar7;
          pcVar7 = strstr(pcVar8 + 10,"Pressure: ");
          if (pcVar7 == (char *)0x0) break;
          pcVar9 = strstr(pcVar7 + 10,"\r\n");
        } while (pcVar9 != (char *)0x0);
      }
      pcVar7 = strstr(local_338,"Temperature: ");
      if ((pcVar7 == (char *)0x0) ||
         (pcVar7 = strstr(pcVar7 + 0xd,"\r\n"), pcVar7 == (char *)0x0 || pcVar8 == (char *)0x0)) {
        do {
          lVar11 = local_368;
          lVar10 = lStack_360;
          if (local_348 == 0) {
            clock_gettime(4,&local_398);
            lVar11 = ((local_398.tv_sec + local_368) - local_388.tv_sec) +
                     (local_398.tv_nsec + lStack_360) / 1000000000;
            lVar10 = (local_398.tv_nsec + lStack_360) % 1000000000 - local_388.tv_nsec;
            if (lVar10 < 0) {
              lVar11 = lVar11 + ~((ulong)-lVar10 / 1000000000);
              lVar10 = lVar10 + 1000000000 + ((ulong)-lVar10 / 1000000000) * 1000000000;
            }
          }
          if (4.0 < (double)lVar10 / 1000000000.0 + (double)lVar11) {
LAB_001bb6ff:
            puts("Error reading data from an ArduinoPressureSensor : Message timeout. ");
            return 2;
          }
          uVar12 = (uint)uVar6;
          if (0x1fe < uVar12) {
            puts("Error reading data from an ArduinoPressureSensor : Invalid data. ");
            return 4;
          }
          pcVar7 = local_338 + (uVar6 & 0xffffffff);
          iVar5 = (pArduinoPressureSensor->RS232Port).DevType;
          if (iVar5 - 1U < 4) {
            uVar6 = recv((pArduinoPressureSensor->RS232Port).s,pcVar7,(ulong)(0x1ff - uVar12),0);
          }
          else {
            if (iVar5 != 0) goto LAB_001bb6d1;
            uVar6 = read(*(int *)&(pArduinoPressureSensor->RS232Port).hDev,pcVar7,
                         (ulong)(0x1ff - uVar12));
          }
          if ((int)uVar6 < 1) goto LAB_001bb6d1;
          if ((pArduinoPressureSensor->bSaveRawData != 0) &&
             ((FILE *)pArduinoPressureSensor->pfSaveFile != (FILE *)0x0)) {
            fwrite(pcVar7,uVar6 & 0xffffffff,1,(FILE *)pArduinoPressureSensor->pfSaveFile);
            fflush((FILE *)pArduinoPressureSensor->pfSaveFile);
          }
          pcVar7 = strstr(local_338,"Pressure: ");
          if ((pcVar7 == (char *)0x0) ||
             (pcVar8 = strstr(pcVar7 + 10,"\r\n"), pcVar8 == (char *)0x0)) {
            pcVar8 = (char *)0x0;
          }
          else {
            do {
              pcVar8 = pcVar7;
              pcVar7 = strstr(pcVar8 + 10,"Pressure: ");
              if (pcVar7 == (char *)0x0) break;
              pcVar9 = strstr(pcVar7 + 10,"\r\n");
            } while (pcVar9 != (char *)0x0);
          }
          pcVar7 = strstr(local_338,"Temperature: ");
          if (pcVar7 == (char *)0x0) {
            bVar13 = true;
          }
          else {
            pcVar7 = strstr(pcVar7 + 0xd,"\r\n");
            bVar13 = pcVar7 == (char *)0x0;
          }
          uVar6 = (ulong)(uVar12 + (int)uVar6);
        } while ((pcVar8 == (char *)0x0) || (bVar13));
      }
      pAVar4 = local_340;
      iVar5 = __isoc99_sscanf(pcVar8,"Pressure: %lf mbar",local_340);
      if (iVar5 == 1) {
        pAVar4->Pressure = pAVar4->pressure / 1000.0;
        iVar5 = __isoc99_sscanf(pcVar8,"Temperature: %lf deg C",&pAVar4->temperature);
        if (iVar5 == 1) {
          (pArduinoPressureSensor->LastArduinoPressureSensorData).Pressure = pAVar4->Pressure;
          dVar1 = pAVar4->pressure;
          dVar2 = pAVar4->temperature;
          dVar3 = pAVar4->altitude;
          (pArduinoPressureSensor->LastArduinoPressureSensorData).depth = pAVar4->depth;
          (pArduinoPressureSensor->LastArduinoPressureSensorData).altitude = dVar3;
          (pArduinoPressureSensor->LastArduinoPressureSensorData).pressure = dVar1;
          (pArduinoPressureSensor->LastArduinoPressureSensorData).temperature = dVar2;
          return 0;
        }
      }
      pcVar7 = "Error reading data from an ArduinoPressureSensor : Invalid data. ";
      goto LAB_001bb6d8;
    }
  }
  else if (iVar5 == 0) {
    uVar6 = read(*(int *)&(pArduinoPressureSensor->RS232Port).hDev,local_338,0xff);
    goto LAB_001bb187;
  }
LAB_001bb6d1:
  pcVar7 = "Error reading data from an ArduinoPressureSensor. ";
LAB_001bb6d8:
  puts(pcVar7);
  return 1;
}

Assistant:

inline int GetLatestDataArduinoPressureSensor(ARDUINOPRESSURESENSOR* pArduinoPressureSensor, ARDUINOPRESSURESENSORDATA* pArduinoPressureSensorData)
{
	char recvbuf[2*MAX_NB_BYTES_ARDUINOPRESSURESENSOR];
	char savebuf[MAX_NB_BYTES_ARDUINOPRESSURESENSOR];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	char* ptr_P = NULL;
	char* ptr_T = NULL;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_ARDUINOPRESSURESENSOR-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pArduinoPressureSensor->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from an ArduinoPressureSensor. \n");
		return EXIT_FAILURE;
	}
	if ((pArduinoPressureSensor->bSaveRawData)&&(pArduinoPressureSensor->pfSaveFile))
	{
		fwrite(recvbuf, Bytes, 1, pArduinoPressureSensor->pfSaveFile);
		fflush(pArduinoPressureSensor->pfSaveFile);
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_ARDUINOPRESSURESENSOR)
			{
				printf("Error reading data from an ArduinoPressureSensor : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pArduinoPressureSensor->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from an ArduinoPressureSensor. \n");
				return EXIT_FAILURE;
			}
			if ((pArduinoPressureSensor->bSaveRawData)&&(pArduinoPressureSensor->pfSaveFile)) 
			{
				fwrite(recvbuf, Bytes, 1, pArduinoPressureSensor->pfSaveFile);
				fflush(pArduinoPressureSensor->pfSaveFile);
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	ptr_P = FindLatestArduinoPressureSensorSentence("Pressure: ", recvbuf);
	ptr_T = FindLatestArduinoPressureSensorSentence("Temperature: ", recvbuf);

	while ((!ptr_P)||(!ptr_T))
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_ARDUINOPRESSURESENSOR)
		{
			printf("Error reading data from an ArduinoPressureSensor : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_ARDUINOPRESSURESENSOR-1)
		{
			printf("Error reading data from an ArduinoPressureSensor : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pArduinoPressureSensor->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_ARDUINOPRESSURESENSOR-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from an ArduinoPressureSensor. \n");
			return EXIT_FAILURE;
		}
		if ((pArduinoPressureSensor->bSaveRawData)&&(pArduinoPressureSensor->pfSaveFile)) 
		{
			fwrite((unsigned char*)recvbuf+BytesReceived, Bytes, 1, pArduinoPressureSensor->pfSaveFile);
			fflush(pArduinoPressureSensor->pfSaveFile);
		}
		BytesReceived += Bytes;
		ptr_P = FindLatestArduinoPressureSensorSentence("Pressure: ", recvbuf);
		ptr_T = FindLatestArduinoPressureSensorSentence("Temperature: ", recvbuf);
	}

	// Analyze data.

	//memset(pArduinoPressureSensorData, 0, sizeof(ARDUINOPRESSURESENSORDATA));

	if (ptr_P)
	{
		if (sscanf(ptr_P, "Pressure: %lf mbar", &pArduinoPressureSensorData->pressure) != 1)
		{
			printf("Error reading data from an ArduinoPressureSensor : Invalid data. \n");
			return EXIT_FAILURE;
		}
		// Conversions...
		pArduinoPressureSensorData->Pressure = pArduinoPressureSensorData->pressure/1000.0;
	}
	if (ptr_T)
	{
		if (sscanf(ptr_P, "Temperature: %lf deg C", &pArduinoPressureSensorData->temperature) != 1)
		{
			printf("Error reading data from an ArduinoPressureSensor : Invalid data. \n");
			return EXIT_FAILURE;
		}
	}

	pArduinoPressureSensor->LastArduinoPressureSensorData = *pArduinoPressureSensorData;

	return EXIT_SUCCESS;
}